

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentProperty(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,string *lhs,string *rhs,CompatibleType t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int *piVar3;
  int *piVar4;
  pointer pcVar5;
  bool bVar6;
  bool bVar7;
  string *psVar8;
  size_type *psVar9;
  pair<bool,_const_char_*> pVar10;
  string null_ptr;
  allocator<char> local_69;
  string local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  paVar1 = &local_68.field_2;
  local_68.field_2._M_allocated_capacity._0_4_ = 0x736e7528;
  local_68._M_string_length = 7;
  local_68.field_2._M_allocated_capacity._4_4_ = 0x297465;
  sVar2 = lhs->_M_string_length;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (sVar2 == 7) {
    piVar3 = (int *)(lhs->_M_dataplus)._M_p;
    if (((*(int *)((long)piVar3 + 3) == 0x29746573 && *piVar3 == 0x736e7528) &&
        (rhs->_M_string_length == 7)) &&
       (piVar4 = (int *)(rhs->_M_dataplus)._M_p,
       *(int *)((long)piVar4 + 3) == 0x29746573 && *piVar4 == 0x736e7528)) {
      __return_storage_ptr__->first = true;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,piVar3,(long)piVar3 + 7);
      goto LAB_002fa17b;
    }
    if (*(int *)((long)piVar3 + 3) == 0x29746573 && *piVar3 == 0x736e7528) {
      __return_storage_ptr__->first = true;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      pcVar5 = (rhs->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,pcVar5,pcVar5 + rhs->_M_string_length);
      goto LAB_002fa17b;
    }
  }
  if ((rhs->_M_string_length == 7) &&
     (piVar3 = (int *)(rhs->_M_dataplus)._M_p,
     *(int *)((long)piVar3 + 3) == 0x29746573 && *piVar3 == 0x736e7528)) {
    __return_storage_ptr__->first = true;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    pcVar5 = (lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,pcVar5,pcVar5 + sVar2);
  }
  else if (t - NumberMinType < 2) {
    pVar10 = consistentNumberProperty((lhs->_M_dataplus)._M_p,(rhs->_M_dataplus)._M_p,t);
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,local_68._M_dataplus._M_p,
                 local_68._M_dataplus._M_p + local_68._M_string_length);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,pVar10.second,&local_69);
    }
    __return_storage_ptr__->first = pVar10.first;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,local_48,local_40 + (long)local_48);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  else if (t == StringType) {
    consistentStringProperty(__return_storage_ptr__,lhs,rhs);
  }
  else {
    if (t != BoolType) {
      __assert_fail("false && \"Unreachable!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                    ,0x1262,
                    "std::pair<bool, std::string> consistentProperty(const std::string &, const std::string &, CompatibleType)"
                   );
    }
    bVar6 = cmSystemTools::IsOn(lhs);
    bVar7 = cmSystemTools::IsOn(rhs);
    bVar6 = bVar6 == bVar7;
    __return_storage_ptr__->first = bVar6;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    psVar8 = &local_68;
    if (bVar6) {
      psVar8 = lhs;
    }
    pcVar5 = (psVar8->_M_dataplus)._M_p;
    psVar9 = &local_68._M_string_length;
    if (bVar6) {
      psVar9 = &lhs->_M_string_length;
    }
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,pcVar5,pcVar5 + *psVar9);
  }
LAB_002fa17b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                             local_68.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> consistentProperty(const std::string& lhs,
                                                const std::string& rhs,
                                                CompatibleType t)
{
  const std::string null_ptr = valueAsString(nullptr);

  if (lhs == null_ptr && rhs == null_ptr) {
    return std::make_pair(true, lhs);
  }
  if (lhs == null_ptr) {
    return std::make_pair(true, rhs);
  }
  if (rhs == null_ptr) {
    return std::make_pair(true, lhs);
  }

  switch (t) {
    case BoolType: {
      bool same = cmSystemTools::IsOn(lhs) == cmSystemTools::IsOn(rhs);
      return std::make_pair(same, same ? lhs : null_ptr);
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType: {
      auto value = consistentNumberProperty(lhs.c_str(), rhs.c_str(), t);
      return std::make_pair(
        value.first, value.first ? std::string(value.second) : null_ptr);
    }
  }
  assert(false && "Unreachable!");
  return std::pair<bool, std::string>(false, null_ptr);
}